

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cc
# Opt level: O2

void brotli::EstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  size_t sVar4;
  size_t v;
  long lVar5;
  ulong uVar6;
  double dVar7;
  size_t histogram [256];
  long local_838 [257];
  
  bVar3 = IsMostlyUTF8(data,pos,mask,len,0.75);
  if (!bVar3) {
    memset(local_838,0,0x800);
    uVar6 = pos;
    sVar4 = 2000;
    v = 2000;
    if (len < 2000) {
      sVar4 = len;
      v = len;
    }
    while (sVar4 != 0) {
      local_838[data[uVar6 & mask]] = local_838[data[uVar6 & mask]] + 1;
      uVar6 = uVar6 + 1;
      sVar4 = sVar4 - 1;
    }
    uVar6 = 0;
    for (lVar5 = -2000; lVar5 - len != -2000; lVar5 = lVar5 + 1) {
      if (1999 < uVar6) {
        local_838[data[pos - 2000 & mask]] = local_838[data[pos - 2000 & mask]] + -1;
        v = v - 1;
      }
      if (uVar6 + 2000 < len) {
        local_838[data[pos + 2000 & mask]] = local_838[data[pos + 2000 & mask]] + 1;
        v = v + 1;
      }
      lVar1 = local_838[data[pos & mask]];
      dVar7 = FastLog2(v);
      dVar2 = FastLog2(lVar1 + (ulong)(lVar1 == 0));
      dVar7 = (dVar7 - dVar2) + 0.029;
      cost[lVar5 + 2000] =
           (float)(double)(-(ulong)(dVar7 < 1.0) & (ulong)(dVar7 * 0.5 + 0.5) |
                          ~-(ulong)(dVar7 < 1.0) & (ulong)dVar7);
      uVar6 = uVar6 + 1;
      pos = pos + 1;
    }
    return;
  }
  EstimateBitCostsForLiteralsUTF8(pos,len,mask,data,cost);
  return;
}

Assistant:

void EstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                 const uint8_t *data, float *cost) {
  if (IsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  }
  size_t histogram[256] = { 0 };
  size_t window_half = 2000;
  size_t in_window = std::min(window_half, len);

  // Bootstrap histogram.
  for (size_t i = 0; i < in_window; ++i) {
    ++histogram[data[(pos + i) & mask]];
  }

  // Compute bit costs with sliding window.
  for (size_t i = 0; i < len; ++i) {
    if (i >= window_half) {
      // Remove a byte in the past.
      --histogram[data[(pos + i - window_half) & mask]];
      --in_window;
    }
    if (i + window_half < len) {
      // Add a byte in the future.
      ++histogram[data[(pos + i + window_half) & mask]];
      ++in_window;
    }
    size_t histo = histogram[data[(pos + i) & mask]];
    if (histo == 0) {
      histo = 1;
    }
    double lit_cost = FastLog2(in_window) - FastLog2(histo);
    lit_cost += 0.029;
    if (lit_cost < 1.0) {
      lit_cost *= 0.5;
      lit_cost += 0.5;
    }
    cost[i] = static_cast<float>(lit_cost);
  }
}